

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_22493e::fillPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  char cVar1;
  long lVar2;
  half *phVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint16_t uVar9;
  long lVar10;
  float fVar11;
  
  lVar10 = (long)width;
  lVar2 = height * lVar10;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar2) {
    uVar5 = lVar2 * 2;
  }
  phVar3 = (half *)operator_new__(uVar5);
  if (ph->_data != (half *)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar10;
  ph->_data = phVar3;
  if (0 < height) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      iVar4 = (int)uVar5;
      if (0 < width) {
        uVar7 = 0;
        do {
          fVar11 = (float)((int)uVar5 + (int)(uVar5 / 0x801) * -0x801);
          if ((uint)fVar11 < 0x38800000) {
            if ((uint)fVar11 < 0x33000001) {
              uVar9 = 0;
            }
            else {
              uVar8 = (uint)fVar11 & 0x7fffff | 0x800000;
              cVar1 = (char)((uint)fVar11 >> 0x17);
              uVar9 = (uint16_t)(uVar8 >> (0x7eU - cVar1 & 0x1f));
              if (0x80000000 < uVar8 << (cVar1 + 0xa2U & 0x1f)) {
                uVar9 = uVar9 + 1;
              }
            }
          }
          else if ((uint)fVar11 < 0x7f800000) {
            if ((uint)fVar11 < 0x477ff000) {
              uVar9 = (uint16_t)
                      ((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
            }
            else {
              uVar9 = 0x7c00;
            }
          }
          else {
            uVar9 = 0x7c00;
            if (fVar11 != INFINITY) {
              uVar8 = (uint)fVar11 >> 0xd & 0x3ff;
              uVar9 = (ushort)(uVar8 == 0) | (ushort)uVar8 | 0x7c00;
            }
          }
          phVar3[uVar7]._h = uVar9;
          uVar7 = uVar7 + 1;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while ((uint)width != uVar7);
      }
      uVar6 = uVar6 + 1;
      uVar5 = (ulong)(uint)(iVar4 + width);
      phVar3 = phVar3 + lVar10;
    } while (uVar6 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}